

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_Init(ARKodeMem ark_mem,int init_type)

{
  void *pvVar1;
  int *piVar2;
  ARKodeHAdaptMem pAVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int error_code;
  char *msgfmt;
  long lVar8;
  size_t __nmemb;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar6 = -0x15;
    error_code = -0x15;
    iVar4 = 0x309;
  }
  else {
    if (init_type - 1U < 2) {
      return 0;
    }
    if ((ark_mem->fixedstep != 0) && (ark_mem->user_efun == 0)) {
      ark_mem->efun = arkEwtSetSmallReal;
      ark_mem->e_data = ark_mem;
    }
    iVar4 = erkStep_SetButcherTable(ark_mem);
    if (iVar4 == 0) {
      iVar4 = erkStep_CheckButcherTable(ark_mem);
      if (iVar4 == 0) {
        piVar2 = *(int **)((long)pvVar1 + 0x20);
        iVar4 = *piVar2;
        pAVar3 = ark_mem->hadapt_mem;
        pAVar3->q = iVar4;
        *(int *)((long)pvVar1 + 0x10) = iVar4;
        iVar4 = piVar2[1];
        pAVar3->p = iVar4;
        *(int *)((long)pvVar1 + 0x14) = iVar4;
        if (iVar4 != 0 || ark_mem->fixedstep != 0) {
          iVar4 = *(int *)((long)pvVar1 + 0x18);
          __nmemb = (size_t)iVar4;
          if (*(long *)((long)pvVar1 + 8) == 0) {
            pvVar5 = calloc(__nmemb,8);
            *(void **)((long)pvVar1 + 8) = pvVar5;
          }
          if (0 < iVar4) {
            lVar8 = 0;
            lVar7 = 0;
            do {
              iVar4 = arkAllocVec(ark_mem,ark_mem->ewt,
                                  (N_Vector *)(*(long *)((long)pvVar1 + 8) + lVar8));
              if (iVar4 == 0) {
                return -0x14;
              }
              lVar7 = lVar7 + 1;
              iVar4 = *(int *)((long)pvVar1 + 0x18);
              __nmemb = (size_t)iVar4;
              lVar8 = lVar8 + 8;
            } while (lVar7 < (long)__nmemb);
          }
          lVar7 = __nmemb + ark_mem->liw;
          ark_mem->liw = lVar7;
          if (*(long *)((long)pvVar1 + 0x30) == 0) {
            pvVar5 = calloc((long)(iVar4 + 1),8);
            *(void **)((long)pvVar1 + 0x30) = pvVar5;
            if (pvVar5 == (void *)0x0) {
              return -0x14;
            }
            ark_mem->lrw = ark_mem->lrw + (long)(iVar4 + 1);
          }
          if (*(long *)((long)pvVar1 + 0x38) == 0) {
            pvVar5 = calloc((long)(iVar4 + 1),8);
            *(void **)((long)pvVar1 + 0x38) = pvVar5;
            if (pvVar5 == (void *)0x0) {
              return -0x14;
            }
            ark_mem->liw = lVar7 + (iVar4 + 1);
          }
          iVar4 = *(int *)((long)pvVar1 + 0x10);
          if (iVar4 < 2) {
            if ((iVar4 == 1) && (1 < ark_mem->interp_degree)) {
              ark_mem->interp_degree = 1;
            }
          }
          else if (iVar4 <= ark_mem->interp_degree) {
            ark_mem->interp_degree = iVar4 + -1;
          }
          ark_mem->call_fullrhs = 1;
          return 0;
        }
        msgfmt = "Adaptive timestepping cannot be performed without embedding coefficients";
        iVar6 = -0x16;
        error_code = -0x16;
        iVar4 = 0x1a3;
      }
      else {
        msgfmt = "Error in Butcher table";
        iVar6 = -0x16;
        error_code = -0x16;
        iVar4 = 0x197;
      }
    }
    else {
      msgfmt = "Could not create Butcher table";
      iVar6 = -0x16;
      error_code = -0x16;
      iVar4 = 0x18e;
    }
  }
  arkProcessError(ark_mem,error_code,iVar4,"erkStep_Init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                  ,msgfmt);
  return iVar6;
}

Assistant:

int erkStep_Init(ARKodeMem ark_mem, int init_type)
{
  ARKodeERKStepMem step_mem;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return (ARK_SUCCESS);
  }

  /* enforce use of arkEwtSmallReal if using a fixed step size
     and an internal error weight function */
  if (ark_mem->fixedstep && !ark_mem->user_efun)
  {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Could not create Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Error in Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
  if (!ark_mem->fixedstep && (step_mem->p == 0))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Adaptive timestepping cannot be performed without embedding coefficients");
    return (ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
  {
    step_mem->F = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
  }
  for (j = 0; j < step_mem->stages; j++)
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
    {
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->liw += step_mem->stages; /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  if (step_mem->cvals == NULL)
  {
    step_mem->cvals = (sunrealtype*)calloc(step_mem->stages + 1,
                                           sizeof(sunrealtype));
    if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->lrw += (step_mem->stages + 1);
  }
  if (step_mem->Xvecs == NULL)
  {
    step_mem->Xvecs = (N_Vector*)calloc(step_mem->stages + 1, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->liw += (step_mem->stages + 1); /* pointers */
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->q - 1;
  }
  else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}